

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O3

void __thiscall sjtu::vector<sjtu::recordType>::doubleSpace(vector<sjtu::recordType> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  int iVar3;
  recordType *prVar4;
  long *plVar5;
  pointer pcVar6;
  recordType *prVar7;
  long lVar8;
  long lVar9;
  
  prVar4 = this->data;
  iVar3 = this->maxSize;
  this->maxSize = iVar3 * 2;
  prVar7 = (recordType *)operator_new((long)iVar3 * 0x120);
  this->data = prVar7;
  if (0 < this->currentLength) {
    lVar9 = 0;
    lVar8 = 0;
    do {
      recordType::recordType
                ((recordType *)
                 ((long)&(((recordType *)(this->data->station + -1))->trainID)._M_dataplus._M_p +
                 lVar9),(recordType *)
                        ((long)&(((recordType *)(prVar4->station + -1))->trainID)._M_dataplus._M_p +
                        lVar9));
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + 0x90;
    } while (lVar8 < this->currentLength);
    prVar7 = prVar4;
    if (0 < this->currentLength) {
      do {
        lVar8 = 0x50;
        do {
          plVar2 = (long *)((long)&(((recordType *)(prVar7->station + -1))->trainID)._M_dataplus.
                                   _M_p + lVar8);
          plVar5 = *(long **)((long)prVar7->station + lVar8 + -0x30);
          if (plVar2 != plVar5) {
            operator_delete(plVar5,*plVar2 + 1);
          }
          lVar8 = lVar8 + -0x20;
        } while (lVar8 != 0x10);
        pcVar6 = (prVar7->trainID)._M_dataplus._M_p;
        paVar1 = &(prVar7->trainID).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar6 != paVar1) {
          operator_delete(pcVar6,paVar1->_M_allocated_capacity + 1);
        }
        prVar7 = prVar7 + 1;
      } while (prVar7 < prVar4 + this->currentLength);
    }
  }
  operator_delete(prVar4);
  return;
}

Assistant:

void doubleSpace() {
                T *tmp = data;
                maxSize *= 2;
                data = (T*) (operator new (maxSize * sizeof(T)));
                for (int i = 0; i < currentLength; ++i)
                        new (data + i) T(tmp[i]);
        for (T* p = tmp; p < tmp + currentLength; ++p)
            p->~T();
                operator delete (tmp);
        }